

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O1

void __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::setIdentity
          (PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *this,Index newSize)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this,(long)newSize);
  uVar1 = *(undefined8 *)(this + 8);
  if (0 < (int)(uint)uVar1) {
    lVar2 = *(long *)this;
    uVar3 = 0;
    do {
      *(int *)(lVar2 + uVar3 * 4) = (int)uVar3;
      uVar3 = uVar3 + 1;
    } while (((uint)uVar1 & 0x7fffffff) != uVar3);
  }
  return;
}

Assistant:

void setIdentity(Index newSize)
    {
      resize(newSize);
      setIdentity();
    }